

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hxx
# Opt level: O2

string * trim(string *str)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  pointer local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  local_30 = (str->_M_dataplus)._M_p;
  local_28.current._M_current =
       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(local_30 + str->_M_string_length);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_20,&local_28,
             (unary_negate<std::pointer_to_unary_function<int,_int>_>)&local_30);
  std::__cxx11::string::erase
            (str,local_20._M_current,(str->_M_dataplus)._M_p + str->_M_string_length);
  pcVar1 = (str->_M_dataplus)._M_p;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                    (pcVar1,pcVar1 + str->_M_string_length,isspace);
  std::__cxx11::string::erase(str,pcVar1,_Var2._M_current);
  return str;
}

Assistant:

static inline string & trim(string & str)
{
  return ltrim(rtrim(str));
}